

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O2

void __thiscall
geometrycentral::NearestNeighborFinder::NearestNeighborFinder
          (NearestNeighborFinder *this,
          vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *points)

{
  KNNImpl *this_00;
  
  (this->impl)._M_t.
  super___uniq_ptr_impl<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  .super__Head_base<0UL,_geometrycentral::NearestNeighborFinder::KNNImpl_*,_false>._M_head_impl =
       (KNNImpl *)0x0;
  this_00 = (KNNImpl *)operator_new(200);
  KNNImpl::KNNImpl(this_00,points);
  std::
  __uniq_ptr_impl<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
  ::reset((__uniq_ptr_impl<geometrycentral::NearestNeighborFinder::KNNImpl,_std::default_delete<geometrycentral::NearestNeighborFinder::KNNImpl>_>
           *)this,this_00);
  return;
}

Assistant:

NearestNeighborFinder::NearestNeighborFinder(const std::vector<Vector3>& points) { impl.reset(new KNNImpl(points)); }